

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall QTextDocumentPrivate::~QTextDocumentPrivate(QTextDocumentPrivate *this)

{
  bool bVar1;
  QObjectPrivate *this_00;
  QTextCursorPrivate **ppQVar2;
  QObjectPrivate *in_RDI;
  StyleSheet *this_01;
  long in_FS_OFFSET;
  QTextCursorPrivate *curs;
  add_const_t<QSet<QTextCursorPrivate_*>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator *in_stack_ffffffffffffffa8;
  const_iterator *in_stack_ffffffffffffffb0;
  undefined1 *puVar3;
  QTextDocumentPrivate *this_02;
  
  this_02 = *(QTextDocumentPrivate **)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR__QTextDocumentPrivate_00e1f5a0;
  this_00 = in_RDI + 0x170;
  puVar3 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QTextCursorPrivate_*>::begin((QSet<QTextCursorPrivate_*> *)this_00);
  QSet<QTextCursorPrivate_*>::end((QSet<QTextCursorPrivate_*> *)this_00);
  while( true ) {
    bVar1 = QSet<QTextCursorPrivate_*>::const_iterator::operator!=
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    ppQVar2 = QSet<QTextCursorPrivate_*>::const_iterator::operator*((const_iterator *)0x7d123a);
    (*ppQVar2)->priv = (QTextDocumentPrivate *)0x0;
    QSet<QTextCursorPrivate_*>::const_iterator::operator++(in_stack_ffffffffffffffb0);
  }
  this_01 = (StyleSheet *)(in_RDI + 0x170);
  QSet<QTextCursorPrivate_*>::clear((QSet<QTextCursorPrivate_*> *)0x7d1271);
  *(undefined4 *)(in_RDI + 0xbc) = 0;
  in_RDI[0xb8] = (QObjectPrivate)0x1;
  clearUndoRedoStacks(this_02,(Stacks)((ulong)puVar3 >> 0x20),SUB81((ulong)puVar3 >> 0x18,0));
  QUrl::~QUrl((QUrl *)(in_RDI + 0x318));
  QString::~QString((QString *)0x7d12b5);
  QString::~QString((QString *)0x7d12c6);
  QString::~QString((QString *)0x7d12d7);
  QString::~QString((QString *)0x7d12e8);
  QCss::StyleSheet::~StyleSheet(this_01);
  QTextOption::~QTextOption((QTextOption *)this_01);
  QString::~QString((QString *)0x7d131b);
  std::function<QVariant_(const_QUrl_&)>::~function((function<QVariant_(const_QUrl_&)> *)0x7d132c);
  QMap<QUrl,_QVariant>::~QMap((QMap<QUrl,_QVariant> *)0x7d133d);
  QMap<QUrl,_QVariant>::~QMap((QMap<QUrl,_QVariant> *)0x7d134e);
  QMap<int,_QTextObject_*>::~QMap((QMap<int,_QTextObject_*> *)0x7d135f);
  QSet<QTextCursorPrivate_*>::~QSet((QSet<QTextCursorPrivate_*> *)0x7d1369);
  QFragmentMap<QTextBlockData>::~QFragmentMap((QFragmentMap<QTextBlockData> *)in_RDI);
  QFragmentMap<QTextFragmentData>::~QFragmentMap((QFragmentMap<QTextFragmentData> *)in_RDI);
  QTextFormatCollection::~QTextFormatCollection((QTextFormatCollection *)this_01);
  QList<QTextUndoCommand>::~QList((QList<QTextUndoCommand> *)0x7d13ad);
  QString::~QString((QString *)0x7d13bb);
  QObjectPrivate::~QObjectPrivate(in_RDI);
  if (*(QTextDocumentPrivate **)(in_FS_OFFSET + 0x28) == this_02) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextDocumentPrivate::~QTextDocumentPrivate()
{
    for (QTextCursorPrivate *curs : std::as_const(cursors))
        curs->priv = nullptr;
    cursors.clear();
    undoState = 0;
    undoEnabled = true;
    clearUndoRedoStacks(QTextDocument::RedoStack);
}